

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

int luaL_typeerror(lua_State *L,int arg,char *tname)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = luaL_getmetafield(L,arg,"__name");
  if (iVar1 == 4) {
    pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
  }
  else {
    iVar1 = lua_type(L,arg);
    if (iVar1 == 2) {
      pcVar2 = "light userdata";
    }
    else {
      iVar1 = lua_type(L,arg);
      pcVar2 = lua_typename(L,iVar1);
    }
  }
  pcVar2 = lua_pushfstring(L,"%s expected, got %s",tname,pcVar2);
  iVar1 = luaL_argerror(L,arg,pcVar2);
  return iVar1;
}

Assistant:

LUALIB_API int luaL_typeerror (lua_State *L, int arg, const char *tname) {
  const char *msg;
  const char *typearg;  /* name for the type of the actual argument */
  if (luaL_getmetafield(L, arg, "__name") == LUA_TSTRING)
    typearg = lua_tostring(L, -1);  /* use the given type name */
  else if (lua_type(L, arg) == LUA_TLIGHTUSERDATA)
    typearg = "light userdata";  /* special name for messages */
  else
    typearg = luaL_typename(L, arg);  /* standard name */
  msg = lua_pushfstring(L, "%s expected, got %s", tname, typearg);
  return luaL_argerror(L, arg, msg);
}